

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O2

bool __thiscall
Diligent::FramebufferCache::FramebufferCacheKey::operator==
          (FramebufferCacheKey *this,FramebufferCacheKey *rhs)

{
  VkImageView *ppVVar1;
  VkImageView *ppVVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  
  sVar3 = GetHash(this);
  sVar4 = GetHash(rhs);
  if ((((sVar3 == sVar4) && (this->Pass == rhs->Pass)) &&
      (this->NumRenderTargets == rhs->NumRenderTargets)) &&
     (((this->DSV == rhs->DSV && (this->ShadingRate == rhs->ShadingRate)) &&
      (this->CommandQueueMask == rhs->CommandQueueMask)))) {
    uVar5 = 0;
    do {
      bVar6 = this->NumRenderTargets == uVar5;
      if (bVar6) {
        return bVar6;
      }
      ppVVar1 = this->RTVs + uVar5;
      ppVVar2 = rhs->RTVs + uVar5;
      uVar5 = uVar5 + 1;
    } while (*ppVVar1 == *ppVVar2);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool FramebufferCache::FramebufferCacheKey::operator==(const FramebufferCacheKey& rhs) const
{
    // clang-format off
    if (GetHash()        != rhs.GetHash()        ||
        Pass             != rhs.Pass             ||
        NumRenderTargets != rhs.NumRenderTargets ||
        DSV              != rhs.DSV              ||
        ShadingRate      != rhs.ShadingRate      ||
        CommandQueueMask != rhs.CommandQueueMask)
    {
        return false;
    }
    // clang-format on

    for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
        if (RTVs[rt] != rhs.RTVs[rt])
            return false;

    return true;
}